

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perm.c
# Opt level: O0

void perm_rand(int n,int *arr)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  int in_EDI;
  int sw;
  int j;
  int i;
  int local_14;
  
  perm_ident(in_EDI,in_RSI);
  for (local_14 = 0; local_14 < in_EDI + -1; local_14 = local_14 + 1) {
    iVar1 = rand();
    iVar2 = local_14 + iVar1 % (in_EDI - local_14);
    iVar1 = in_RSI[iVar2];
    in_RSI[iVar2] = in_RSI[local_14];
    in_RSI[local_14] = iVar1;
  }
  return;
}

Assistant:

void perm_rand(int n, int* arr)
{
	perm_ident(n, arr);
	for (int i = 0; i < n - 1; ++i) {
		int j = i + rand() % (n - i);
		const int sw = arr[j];
		arr[j] = arr[i];
		arr[i] = sw;
	}
}